

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O0

Gia_Man_t * Acec_ManDecla(Gia_Man_t *pGia,int fBooth,int fVerbose)

{
  Vec_Int_t *vRes;
  abctime aVar1;
  Acec_Box_t *local_50;
  Vec_Int_t *vResult;
  Acec_Box_t *pBox;
  Vec_Bit_t *vIgnore;
  Gia_Man_t *pNew;
  abctime clk;
  int fVerbose_local;
  int fBooth_local;
  Gia_Man_t *pGia_local;
  
  clk._0_4_ = fVerbose;
  clk._4_4_ = fBooth;
  _fVerbose_local = pGia;
  pNew = (Gia_Man_t *)Abc_Clock();
  vIgnore = (Vec_Bit_t *)0x0;
  if (clk._4_4_ == 0) {
    local_50 = (Acec_Box_t *)0x0;
  }
  else {
    local_50 = (Acec_Box_t *)Acec_BoothFindPPG(_fVerbose_local);
  }
  pBox = local_50;
  vResult = (Vec_Int_t *)Acec_DeriveBox(_fVerbose_local,(Vec_Bit_t *)local_50,0,0,(int)clk);
  Vec_BitFreeP((Vec_Bit_t **)&pBox);
  if (vResult == (Vec_Int_t *)0x0) {
    printf("Cannot find arithmetic boxes.\n");
    pGia_local = Gia_ManDup(_fVerbose_local);
  }
  else {
    vRes = Acec_RewriteTop(_fVerbose_local,(Acec_Box_t *)vResult);
    Acec_BoxFreeP((Acec_Box_t **)&vResult);
    vIgnore = (Vec_Bit_t *)Acec_RewriteReplace(_fVerbose_local,vRes);
    Vec_IntFree(vRes);
    aVar1 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar1 - (long)pNew);
    pGia_local = (Gia_Man_t *)vIgnore;
  }
  return pGia_local;
}

Assistant:

Gia_Man_t * Acec_ManDecla( Gia_Man_t * pGia, int fBooth, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew = NULL;
    Vec_Bit_t * vIgnore = fBooth ? Acec_BoothFindPPG(pGia) : NULL;
    Acec_Box_t * pBox = Acec_DeriveBox( pGia, vIgnore, 0, 0, fVerbose );
    Vec_Int_t * vResult;
    Vec_BitFreeP( &vIgnore );
    if ( pBox == NULL ) // cannot match
    {
        printf( "Cannot find arithmetic boxes.\n" );
        return Gia_ManDup( pGia );
    }
    vResult = Acec_RewriteTop( pGia, pBox );
    Acec_BoxFreeP( &pBox );
    pNew = Acec_RewriteReplace( pGia, vResult );
    Vec_IntFree( vResult );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return pNew;
}